

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

int __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_>::ClassId
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZCompElWithMem",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZIntelGen<pzshape::TPZShapeTetra>::ClassId((TPZIntelGen<pzshape::TPZShapeTetra> *)this);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZCompElWithMem<TBASE>::ClassId() const{
    return Hash("TPZCompElWithMem") ^ TBASE::ClassId() << 1;
}